

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

void mqtt_reinit(mqtt_client *client,mqtt_pal_socket_handle socketfd,uint8_t *sendbuf,
                size_t sendbufsz,uint8_t *recvbuf,size_t recvbufsz)

{
  mqtt_queued_message *pmVar1;
  size_t sVar2;
  
  client->error = MQTT_ERROR_CONNECT_NOT_CALLED;
  client->socketfd = socketfd;
  (client->mq).mem_start = sendbuf;
  pmVar1 = (mqtt_queued_message *)(sendbuf + sendbufsz);
  (client->mq).mem_end = pmVar1;
  (client->mq).curr = sendbuf;
  (client->mq).queue_tail = pmVar1;
  if ((sendbuf == (uint8_t *)0x0) ||
     (sVar2 = (long)(pmVar1 + -1) - (long)sendbuf, pmVar1 + -1 < sendbuf || sVar2 == 0)) {
    sVar2 = 0;
  }
  (client->mq).curr_sz = sVar2;
  (client->recv_buffer).mem_start = recvbuf;
  (client->recv_buffer).mem_size = recvbufsz;
  (client->recv_buffer).curr = recvbuf;
  (client->recv_buffer).curr_sz = recvbufsz;
  return;
}

Assistant:

void mqtt_reinit(struct mqtt_client* client,
                 mqtt_pal_socket_handle socketfd,
                 uint8_t *sendbuf, size_t sendbufsz,
                 uint8_t *recvbuf, size_t recvbufsz)
{
    client->error = MQTT_ERROR_CONNECT_NOT_CALLED;
    client->socketfd = socketfd;

    mqtt_mq_init(&client->mq, sendbuf, sendbufsz);

    client->recv_buffer.mem_start = recvbuf;
    client->recv_buffer.mem_size = recvbufsz;
    client->recv_buffer.curr = client->recv_buffer.mem_start;
    client->recv_buffer.curr_sz = client->recv_buffer.mem_size;
}